

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O3

void av1_get_tpl_stats_sb
               (AV1_COMP *cpi,BLOCK_SIZE bsize,int mi_row,int mi_col,SuperBlockEnc *sb_enc)

{
  undefined8 *puVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  int stride;
  AV1_PRIMARY *pAVar6;
  TplDepFrame *pTVar7;
  long lVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int_mv *piVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int mi_col_00;
  int_mv *piVar22;
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  long lVar24;
  
  sb_enc->tpl_data_count = 0;
  if ((cpi->oxcf).algo_cfg.enable_tpl_model != true) {
    return;
  }
  if ((cpi->common).current_frame.frame_type == '\0') {
    return;
  }
  pAVar6 = cpi->ppi;
  bVar2 = cpi->gf_frame_index;
  if (((pAVar6->gf_group).update_type[bVar2] & 0xfe) == 4) {
    return;
  }
  iVar13 = av1_tpl_stats_ready(&pAVar6->tpl_data,(uint)bVar2);
  if (iVar13 == 0) {
    return;
  }
  bVar3 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[bsize];
  pTVar7 = (pAVar6->tpl_data).tpl_frame;
  bVar4 = (cpi->common).superres_scale_denominator;
  iVar19 = (uint)bVar4 * mi_col;
  iVar13 = iVar19 + 4;
  iVar19 = iVar19 + 0xb;
  if (-1 < iVar13) {
    iVar19 = iVar13;
  }
  iVar19 = iVar19 >> 3;
  iVar20 = ((uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                  [bsize] + mi_col) * (uint)bVar4;
  iVar13 = iVar20 + 4;
  iVar20 = iVar20 + 0xb;
  if (-1 < iVar13) {
    iVar20 = iVar13;
  }
  iVar20 = iVar20 >> 3;
  iVar13 = (cpi->common).superres_upscaled_width;
  bVar5 = (pAVar6->tpl_data).tpl_bsize_1d;
  if (bVar5 < 0x10) {
    if (bVar5 == 4) {
      lVar18 = 0;
      goto LAB_001a620f;
    }
    if (bVar5 == 8) {
      lVar18 = 3;
      goto LAB_001a620f;
    }
  }
  else if (bVar5 != 0x10) {
    lVar18 = 0xc;
    if (bVar5 == 0x40) goto LAB_001a620f;
    if (bVar5 == 0x20) {
      lVar18 = 9;
      goto LAB_001a620f;
    }
  }
  lVar18 = 6;
LAB_001a620f:
  lVar8 = *(long *)((long)pTVar7->ref_map_index + ((ulong)((uint)bVar2 * 0x60) - 0x18));
  stride = *(int *)((long)pTVar7->ref_map_index + (ulong)((uint)bVar2 * 0x60) + 0x20);
  bVar2 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[lVar18];
  uVar17 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                 [lVar18] * (uint)bVar4 + 4 >> 3;
  sb_enc->tpl_stride = (iVar20 - iVar19) / (int)uVar17;
  iVar21 = (uint)bVar3 + mi_row;
  iVar16 = 0;
  lVar18 = 0;
  auVar26 = _DAT_004ce530;
  do {
    if (iVar19 < iVar20) {
      lVar18 = (long)(int)lVar18;
      piVar22 = sb_enc->tpl_mv[lVar18] + 3;
      mi_col_00 = iVar19;
      do {
        if ((mi_row < (cpi->common).mi_params.mi_rows) &&
           (mi_col_00 < (int)(iVar13 + 7 >> 2 & 0xfffffffeU))) {
          iVar14 = av1_tpl_ptr_pos(mi_row,mi_col_00,stride,
                                   (pAVar6->tpl_data).tpl_stats_block_mis_log2);
          auVar26 = _DAT_004ce530;
          lVar15 = (long)iVar14 * 200;
          sb_enc->tpl_inter_cost[lVar18] = (long)(*(int *)(lVar8 + 0x8c + lVar15) << 4);
          sb_enc->tpl_intra_cost[lVar18] = (long)(*(int *)(lVar8 + 0x88 + lVar15) << 4);
          puVar1 = (undefined8 *)(lVar8 + 0xa4 + lVar15);
          uVar9 = *puVar1;
          uVar10 = puVar1[1];
          puVar1 = (undefined8 *)(lVar8 + 0xb0 + lVar15);
          uVar11 = puVar1[1];
          piVar12 = sb_enc->tpl_mv[lVar18];
          *(undefined8 *)(piVar12 + 3) = *puVar1;
          *(undefined8 *)(piVar12 + 5) = uVar11;
          *(undefined8 *)sb_enc->tpl_mv[lVar18] = uVar9;
          *(undefined8 *)(sb_enc->tpl_mv[lVar18] + 2) = uVar10;
          iVar16 = iVar16 + 1;
        }
        else {
          sb_enc->tpl_inter_cost[lVar18] = 0x7fffffffffffffff;
          sb_enc->tpl_intra_cost[lVar18] = 0x7fffffffffffffff;
          lVar15 = 0;
          auVar23 = _DAT_004ce520;
          auVar25 = _DAT_004ce510;
          do {
            if (SUB164(auVar23 ^ auVar26,4) == -0x80000000 &&
                SUB164(auVar23 ^ auVar26,0) < -0x7ffffff9) {
              piVar22[lVar15 + -3].as_int = 0x80008000;
              piVar22[lVar15 + -2].as_int = 0x80008000;
            }
            if (SUB164(auVar25 ^ auVar26,4) == -0x80000000 &&
                SUB164(auVar25 ^ auVar26,0) < -0x7ffffff9) {
              piVar22[lVar15 + -1].as_int = 0x80008000;
              piVar22[lVar15].as_int = 0x80008000;
            }
            lVar15 = lVar15 + 4;
            lVar24 = auVar23._8_8_;
            auVar23._0_8_ = auVar23._0_8_ + 4;
            auVar23._8_8_ = lVar24 + 4;
            lVar24 = auVar25._8_8_;
            auVar25._0_8_ = auVar25._0_8_ + 4;
            auVar25._8_8_ = lVar24 + 4;
          } while (lVar15 != 8);
        }
        lVar18 = lVar18 + 1;
        mi_col_00 = mi_col_00 + uVar17;
        piVar22 = piVar22 + 7;
      } while (mi_col_00 < iVar20);
    }
    mi_row = mi_row + (uint)bVar2;
  } while (mi_row < iVar21);
  sb_enc->tpl_data_count = iVar16;
  return;
}

Assistant:

void av1_get_tpl_stats_sb(AV1_COMP *cpi, BLOCK_SIZE bsize, int mi_row,
                          int mi_col, SuperBlockEnc *sb_enc) {
  sb_enc->tpl_data_count = 0;

  if (!cpi->oxcf.algo_cfg.enable_tpl_model) return;
  if (cpi->common.current_frame.frame_type == KEY_FRAME) return;
  const FRAME_UPDATE_TYPE update_type =
      get_frame_update_type(&cpi->ppi->gf_group, cpi->gf_frame_index);
  if (update_type == INTNL_OVERLAY_UPDATE || update_type == OVERLAY_UPDATE)
    return;
  assert(IMPLIES(cpi->ppi->gf_group.size > 0,
                 cpi->gf_frame_index < cpi->ppi->gf_group.size));

  AV1_COMMON *const cm = &cpi->common;
  const int gf_group_index = cpi->gf_frame_index;
  TplParams *const tpl_data = &cpi->ppi->tpl_data;
  if (!av1_tpl_stats_ready(tpl_data, gf_group_index)) return;
  const int mi_wide = mi_size_wide[bsize];
  const int mi_high = mi_size_high[bsize];

  TplDepFrame *tpl_frame = &tpl_data->tpl_frame[gf_group_index];
  TplDepStats *tpl_stats = tpl_frame->tpl_stats_ptr;
  int tpl_stride = tpl_frame->stride;

  int mi_count = 0;
  int count = 0;
  const int mi_col_sr =
      coded_to_superres_mi(mi_col, cm->superres_scale_denominator);
  const int mi_col_end_sr =
      coded_to_superres_mi(mi_col + mi_wide, cm->superres_scale_denominator);
  // mi_cols_sr is mi_cols at superres case.
  const int mi_cols_sr = av1_pixels_to_mi(cm->superres_upscaled_width);

  // TPL store unit size is not the same as the motion estimation unit size.
  // Here always use motion estimation size to avoid getting repetitive inter/
  // intra cost.
  const BLOCK_SIZE tpl_bsize = convert_length_to_bsize(tpl_data->tpl_bsize_1d);
  assert(mi_size_wide[tpl_bsize] == mi_size_high[tpl_bsize]);
  const int row_step = mi_size_high[tpl_bsize];
  const int col_step_sr = coded_to_superres_mi(mi_size_wide[tpl_bsize],
                                               cm->superres_scale_denominator);

  // Stride is only based on SB size, and we fill in values for every 16x16
  // block in a SB.
  sb_enc->tpl_stride = (mi_col_end_sr - mi_col_sr) / col_step_sr;

  for (int row = mi_row; row < mi_row + mi_high; row += row_step) {
    for (int col = mi_col_sr; col < mi_col_end_sr; col += col_step_sr) {
      assert(count < MAX_TPL_BLK_IN_SB * MAX_TPL_BLK_IN_SB);
      // Handle partial SB, so that no invalid values are used later.
      if (row >= cm->mi_params.mi_rows || col >= mi_cols_sr) {
        sb_enc->tpl_inter_cost[count] = INT64_MAX;
        sb_enc->tpl_intra_cost[count] = INT64_MAX;
        for (int i = 0; i < INTER_REFS_PER_FRAME; ++i) {
          sb_enc->tpl_mv[count][i].as_int = INVALID_MV;
        }
        count++;
        continue;
      }

      TplDepStats *this_stats = &tpl_stats[av1_tpl_ptr_pos(
          row, col, tpl_stride, tpl_data->tpl_stats_block_mis_log2)];
      sb_enc->tpl_inter_cost[count] = this_stats->inter_cost
                                      << TPL_DEP_COST_SCALE_LOG2;
      sb_enc->tpl_intra_cost[count] = this_stats->intra_cost
                                      << TPL_DEP_COST_SCALE_LOG2;
      memcpy(sb_enc->tpl_mv[count], this_stats->mv, sizeof(this_stats->mv));
      mi_count++;
      count++;
    }
  }

  assert(mi_count <= MAX_TPL_BLK_IN_SB * MAX_TPL_BLK_IN_SB);
  sb_enc->tpl_data_count = mi_count;
}